

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

void print(int **arr,string *s,int width)

{
  ostream *poVar1;
  ulong uVar2;
  int j;
  long lVar3;
  int i;
  long lVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)s);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar4 = 1; uVar2 = (ulong)bsize, lVar4 <= (long)uVar2; lVar4 = lVar4 + 1) {
    for (lVar3 = 1; lVar3 <= (int)uVar2; lVar3 = lVar3 + 1) {
      poVar1 = std::operator<<(&std::cout,0x20);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)width;
      std::ostream::operator<<((ostream *)poVar1,arr[lVar4][lVar3]);
      uVar2 = (ulong)(uint)bsize;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void print(int **arr, const string &s, int width = 1) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << setfill(' ') << setw(width) << arr[i][j];
        }
        cout << endl;
    }
}